

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  Unique<vk::Handle<(vk::HandleType)19>_> *pUVar1;
  TestStatus *pTVar2;
  DeviceInterface *vk;
  VkDevice device;
  Unique<vk::Handle<(vk::HandleType)22>_> obj2;
  Unique<vk::Handle<(vk::HandleType)22>_> obj1;
  Unique<vk::Handle<(vk::HandleType)22>_> obj0;
  Resources res;
  Environment env;
  VkDescriptorSetAllocateInfo local_1b0;
  Move<vk::Handle<(vk::HandleType)22>_> local_188;
  Move<vk::Handle<(vk::HandleType)22>_> local_168;
  TestStatus *local_140;
  VkDescriptorPool *local_138;
  DeviceInterface *pDStack_130;
  VkDevice local_128;
  deUint64 dStack_120;
  Move<vk::Handle<(vk::HandleType)22>_> local_110;
  Resources local_f0;
  Environment local_68;
  
  local_68.vkp = context->m_platformInterface;
  local_140 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(context);
  local_68.vkd = vk;
  device = Context::getDevice(context);
  local_68.device = device;
  local_68.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_68.programBinaries = context->m_progCollection;
  local_68.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_68.maxResourceConsumers = 4;
  DescriptorSet::Resources::Resources(&local_f0,&local_68,params);
  local_1b0.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_1b0.pNext = (void *)0x0;
  local_1b0.descriptorPool.m_internal =
       local_f0.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  local_1b0.descriptorSetCount = 1;
  pUVar1 = &local_f0.descriptorSetLayout.object;
  local_1b0.pSetLayouts = (VkDescriptorSetLayout *)pUVar1;
  ::vk::allocateDescriptorSet(&local_168,vk,device,&local_1b0);
  local_138 = (VkDescriptorPool *)
              local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  pDStack_130 = local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                m_deviceIface;
  local_128 = local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  dStack_120 = local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal;
  local_1b0.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_1b0.pNext = (void *)0x0;
  local_1b0.descriptorPool.m_internal =
       local_f0.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  local_1b0.descriptorSetCount = 1;
  local_1b0.pSetLayouts = (VkDescriptorSetLayout *)pUVar1;
  ::vk::allocateDescriptorSet(&local_188,vk,device,&local_1b0);
  local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
  local_1b0.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_1b0.pNext = (void *)0x0;
  local_1b0.descriptorPool.m_internal =
       local_f0.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  local_1b0.descriptorSetCount = 1;
  local_1b0.pSetLayouts = (VkDescriptorSetLayout *)pUVar1;
  ::vk::allocateDescriptorSet(&local_110,vk,device,&local_1b0);
  local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
  local_1b0.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_1b0.pNext = (void *)0x0;
  local_1b0.descriptorPool.m_internal =
       local_f0.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  local_1b0.descriptorSetCount = 1;
  local_1b0.pSetLayouts = (VkDescriptorSetLayout *)pUVar1;
  ::vk::allocateDescriptorSet(&local_110,vk,device,&local_1b0);
  pTVar2 = local_140;
  if (local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
    local_1b0._0_8_ =
         local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (*(local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ,local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal,1);
  }
  if (local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
    local_1b0._0_8_ =
         local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (*(local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ,local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal,1);
  }
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
    local_1b0._0_8_ =
         local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (*(local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ,local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               local_168.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal,1);
  }
  if (local_138 != (VkDescriptorPool *)0x0) {
    local_1b0._0_8_ = local_138;
    (*pDStack_130->_vptr_DeviceInterface[0x3d])(pDStack_130,local_128,dStack_120,1);
  }
  local_1b0._0_8_ = &local_1b0.descriptorPool;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Ok","");
  pTVar2->m_code = QP_TEST_RESULT_PASS;
  (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar2->m_description,local_1b0._0_8_,
             (long)local_1b0.pNext + local_1b0._0_8_);
  if ((VkDescriptorPool *)local_1b0._0_8_ != &local_1b0.descriptorPool) {
    operator_delete((void *)local_1b0._0_8_,local_1b0.descriptorPool.m_internal + 1);
  }
  DescriptorSet::Resources::~Resources(&local_f0);
  return pTVar2;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}